

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::SizeIsMatcher<int>::
Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>::
MatchAndExplain(Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>
                *this,RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *container,
               MatchResultListener *listener)

{
  byte bVar1;
  MatchResultListener *pMVar2;
  ostream *os;
  string local_200;
  char *local_1e0 [3];
  byte local_1c1;
  undefined1 local_1c0 [7];
  bool result;
  StringMatchResultListener size_listener;
  SizeType size;
  MatchResultListener *listener_local;
  RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *container_local;
  Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>
  *this_local;
  
  size_listener._404_4_ =
       google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>::size
                 (container);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c0);
  local_1c1 = MatcherBase<int>::MatchAndExplain
                        (&(this->size_matcher_).super_MatcherBase<int>,
                         (int *)&size_listener.field_0x194,(MatchResultListener *)local_1c0);
  pMVar2 = MatchResultListener::operator<<(listener,(char (*) [12])"whose size ");
  pMVar2 = MatchResultListener::operator<<(pMVar2,(int *)&size_listener.field_0x194);
  local_1e0[0] = " doesn\'t match";
  if ((local_1c1 & 1) != 0) {
    local_1e0[0] = " matches";
  }
  MatchResultListener::operator<<(pMVar2,local_1e0);
  StringMatchResultListener::str_abi_cxx11_(&local_200,(StringMatchResultListener *)local_1c0);
  os = MatchResultListener::stream(listener);
  PrintIfNotEmpty(&local_200,os);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = local_1c1;
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool MatchAndExplain(Container container,
                         MatchResultListener* listener) const override {
      SizeType size = container.size();
      StringMatchResultListener size_listener;
      const bool result = size_matcher_.MatchAndExplain(size, &size_listener);
      *listener << "whose size " << size
                << (result ? " matches" : " doesn't match");
      PrintIfNotEmpty(size_listener.str(), listener->stream());
      return result;
    }